

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputSetInfo(HelicsInput inp,char *info,HelicsError *err)

{
  Input *this;
  InputObject *pIVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view info_00;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar1 != (InputObject *)0x0) {
    this = pIVar1->inputPtr;
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (info != (char *)0x0) {
      sVar2 = strlen(info);
      _Var3._M_p = info;
    }
    info_00._M_str = _Var3._M_p;
    info_00._M_len = sVar2;
    helics::Interface::setInfo(&this->super_Interface,info_00);
  }
  return;
}

Assistant:

void helicsInputSetInfo(HelicsInput inp, const char* info, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->setInfo(AS_STRING_VIEW(info));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}